

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O2

int ddWindow3(DdManager *table,int low,int high)

{
  int iVar1;
  
  if (high - low < 2) {
    iVar1 = ddWindow2(table,low,high);
    return iVar1;
  }
  do {
    if (high <= low + 1) {
      return 1;
    }
    iVar1 = ddPermuteWindow3(table,low);
    low = low + 1;
  } while (iVar1 != 0);
  return 0;
}

Assistant:

static int
ddWindow3(
  DdManager * table,
  int  low,
  int  high)
{

    int x;
    int res;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 2) return(ddWindow2(table,low,high));

    for (x = low; x+1 < high; x++) {
        res = ddPermuteWindow3(table,x);
        if (res == 0) return(0);
#ifdef DD_STATS
        if (res == ABC) {
            (void) fprintf(table->out,"=");
        } else {
            (void) fprintf(table->out,"-");
        }
        fflush(table->out);
#endif
    }

    return(1);

}